

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::unget(lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
        *this)

{
  int iVar1;
  bool bVar2;
  int_type iVar3;
  lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
  *this_local;
  
  this->next_unget = true;
  (this->position).chars_read_total = (this->position).chars_read_total - 1;
  if ((this->position).chars_read_current_line == 0) {
    if ((this->position).lines_read != 0) {
      (this->position).lines_read = (this->position).lines_read - 1;
    }
  }
  else {
    (this->position).chars_read_current_line = (this->position).chars_read_current_line - 1;
  }
  iVar1 = this->current;
  iVar3 = std::char_traits<char>::eof();
  if (iVar1 != iVar3) {
    bVar2 = std::vector<char,_std::allocator<char>_>::empty(&this->token_string);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!token_string.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dinopony[P]randstalker/extlibs/landstalker_lib/landstalker-lib/tools/json.hpp"
                    ,0x1f4f,
                    "void nlohmann::detail::lexer<nlohmann::basic_json<nlohmann::ordered_map>, nlohmann::detail::input_stream_adapter>::unget() [BasicJsonType = nlohmann::basic_json<nlohmann::ordered_map>, InputAdapterType = nlohmann::detail::input_stream_adapter]"
                   );
    }
    std::vector<char,_std::allocator<char>_>::pop_back(&this->token_string);
  }
  return;
}

Assistant:

void unget()
    {
        next_unget = true;

        --position.chars_read_total;

        // in case we "unget" a newline, we have to also decrement the lines_read
        if (position.chars_read_current_line == 0)
        {
            if (position.lines_read > 0)
            {
                --position.lines_read;
            }
        }
        else
        {
            --position.chars_read_current_line;
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            JSON_ASSERT(!token_string.empty());
            token_string.pop_back();
        }
    }